

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,long),char_data*&,long&>
          (CQueue *this,int nTimer,string *from,string *funcName,_func_void_char_data_ptr_long *func
          ,char_data **args,long *args_1)

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  function<void_()> *in_RDI;
  CLogger *in_R8;
  size_t *in_R9;
  undefined8 *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_long_&> tuple;
  char_data **in_stack_fffffffffffffe98;
  value_type *__x;
  tuple<char_data_*&,_long_&> *in_stack_fffffffffffffea0;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffea8;
  anon_class_24_3_3bdf3dc2 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  function<void_()> *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffee8;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffef0;
  size_t sVar1;
  char *pcVar2;
  string local_e8 [32];
  undefined1 local_c8 [112];
  anon_class_24_3_3bdf3dc2 local_58;
  size_t *local_30;
  CLogger *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_58._16_8_ = 2;
    fmt._M_str = (char *)in_stack_fffffffffffffee8;
    fmt._M_len = (size_t)in_stack_fffffffffffffee0;
    CLogger::Warn<unsigned_long>((CLogger *)in_stack_fffffffffffffed8,fmt,(unsigned_long *)in_RDI);
  }
  __f = &local_58;
  std::tuple<char_data_*&,_long_&>::tuple<true,_true>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(long *)0x22ca35);
  GetCharacterData<char_data*&,long&>((CQueue *)in_RDX,(tuple<char_data_*&,_long_&> *)in_RCX);
  args_2 = in_RDI;
  std::__cxx11::string::string(local_e8,in_RDX);
  this_00 = (queueEntry_t *)local_c8;
  std::__cxx11::string::string((string *)this_00,in_RCX);
  __x = (value_type *)(local_c8 + 0x20);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  sVar1 = *local_30;
  pcVar2 = (char *)*in_stack_00000008;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,long),char_data*&,long&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,long),char_data*&,long&)::_lambda()_1_,void>
            (in_RDI,__f);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,__x);
  queueEntry_t::~queueEntry_t(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__f);
  fmt_00._M_str = pcVar2;
  fmt_00._M_len = sVar1;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            (local_28,fmt_00,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(int *)args_2);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDI);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}